

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

void ps_free_searches(ps_decoder_t *ps)

{
  hash_iter_t *local_18;
  hash_iter_t *search_it;
  ps_decoder_t *ps_local;
  
  if (ps->searches != (hash_table_t *)0x0) {
    for (local_18 = hash_table_iter(ps->searches); local_18 != (hash_iter_t *)0x0;
        local_18 = hash_table_iter_next(local_18)) {
      (**(code **)(*local_18->ent->val + 0x20))(local_18->ent->val);
    }
    hash_table_free(ps->searches);
  }
  ps->searches = (hash_table_t *)0x0;
  ps->search = (ps_search_t *)0x0;
  return;
}

Assistant:

static void
ps_free_searches(ps_decoder_t *ps)
{
    if (ps->searches) {
        hash_iter_t *search_it;
        for (search_it = hash_table_iter(ps->searches); search_it;
             search_it = hash_table_iter_next(search_it)) {
            ps_search_free(hash_entry_val(search_it->ent));
        }
        hash_table_free(ps->searches);
    }

    ps->searches = NULL;
    ps->search = NULL;
}